

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O3

ConstantRange __thiscall slang::ConstantRange::intersect(ConstantRange *this,ConstantRange other)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar7 = other.left;
  uVar4 = (ulong)other >> 0x20;
  uVar1 = this->left;
  uVar5 = this->right;
  uVar2 = uVar1;
  if ((int)uVar5 < (int)uVar1) {
    uVar2 = uVar5;
  }
  uVar3 = other.right;
  uVar8 = uVar3;
  if ((int)uVar3 < (int)uVar7) {
    uVar8 = uVar7;
  }
  if ((int)uVar2 <= (int)uVar8) {
    if ((int)uVar5 < (int)uVar1) {
      uVar5 = uVar1;
    }
    if ((int)uVar7 <= (int)uVar3) {
      uVar4 = (ulong)other & 0xffffffff;
    }
    if ((int)uVar4 <= (int)uVar5) {
      if ((int)uVar4 < (int)uVar2) {
        uVar4 = (ulong)uVar2;
      }
      if ((int)uVar8 < (int)uVar5) {
        uVar5 = uVar8;
      }
      uVar6 = (ulong)uVar5 << 0x20;
      goto LAB_002e7dc7;
    }
  }
  uVar4 = 0;
  uVar6 = 0;
LAB_002e7dc7:
  return (ConstantRange)(uVar4 | uVar6);
}

Assistant:

ConstantRange ConstantRange::intersect(ConstantRange other) const {
    if (overlaps(other)) {
        ConstantRange result;
        result.left = std::max(lower(), other.lower());
        result.right = std::min(upper(), other.upper());
        return result;
    }
    return ConstantRange();
}